

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON__UINT32 __thiscall
ON_ObjectArray<ON_BrepEdge>::DataCRC(ON_ObjectArray<ON_BrepEdge> *this,ON__UINT32 current_remainder)

{
  ON_BrepEdge *pOVar1;
  int local_18;
  uint local_14;
  int i;
  ON__UINT32 current_remainder_local;
  ON_ObjectArray<ON_BrepEdge> *this_local;
  
  local_14 = current_remainder;
  for (local_18 = 0; local_18 < (this->super_ON_ClassArray<ON_BrepEdge>).m_count;
      local_18 = local_18 + 1) {
    pOVar1 = (this->super_ON_ClassArray<ON_BrepEdge>).m_a + local_18;
    local_14 = (*(pOVar1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                 _vptr_ON_Object[9])(pOVar1,(ulong)local_14);
  }
  return local_14;
}

Assistant:

ON__UINT32 ON_ObjectArray<T>::DataCRC(ON__UINT32 current_remainder) const
{
  // The "this->" in this->m_count and this->m_a 
  // are needed for gcc 4 to compile.
  int i;
  for ( i = 0; i < this->m_count; i++ )
  {
    current_remainder = this->m_a[i].DataCRC(current_remainder);
  }
  return current_remainder;
}